

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void MultiplicationHelper<signed_char,_long,_14>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(char t,long *u,char *ret)

{
  undefined3 in_register_00000039;
  int32_t tmp;
  int64_t u1;
  int32_t local_1c;
  long local_18;
  
  local_18 = *u;
  local_1c = 0;
  LargeIntRegMultiply<int,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (CONCAT31(in_register_00000039,t),&local_18,&local_1c);
  if ((char)local_1c == local_1c) {
    *ret = (char)local_1c;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void MultiplyThrow(T t, const U& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isInt64, "U must be Int64");
        std::int64_t u1 = u;
        std::int32_t tmp = 0;

        LargeIntRegMultiply< std::int32_t, std::int64_t >::template RegMultiplyThrow< E >( (std::int32_t)t, u1, &tmp );
        SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::template CastThrow< E >( tmp, ret );
    }